

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

int Amap_ManFindCut(Amap_Obj_t *pNode,Amap_Obj_t *pFanin,int fComplFanin,int Val,Vec_Ptr_t *vCuts)

{
  int iVar1;
  void **__ptr;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  
  vCuts->nSize = 0;
  puVar3 = (uint *)(pFanin->field_11).pData;
  for (iVar4 = 0; iVar4 < (int)pFanin->nCuts; iVar4 = iVar4 + 1) {
    uVar2 = *puVar3 & 0xffff;
    if (uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = Abc_Var2Lit(uVar2,*puVar3 >> 0x10 & 1 ^ fComplFanin);
    }
    if (iVar1 == Val) {
      iVar1 = vCuts->nSize;
      if (iVar1 == vCuts->nCap) {
        uVar2 = iVar1 * 2;
        if (iVar1 < 0x10) {
          uVar2 = 0x10;
        }
        __ptr = vCuts->pArray;
        if (iVar1 < (int)uVar2) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar2 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar2 << 3);
            iVar1 = vCuts->nSize;
          }
          vCuts->pArray = __ptr;
          vCuts->nCap = uVar2;
        }
      }
      else {
        __ptr = vCuts->pArray;
      }
      vCuts->nSize = iVar1 + 1;
      __ptr[iVar1] = puVar3;
    }
    puVar3 = puVar3 + (ulong)(*puVar3 >> 0x11) + 1;
  }
  return (int)(vCuts->nSize == 0);
}

Assistant:

int Amap_ManFindCut( Amap_Obj_t * pNode, Amap_Obj_t * pFanin, int fComplFanin, int Val, Vec_Ptr_t * vCuts )
{
    Amap_Cut_t * pCut;
    int c, iCompl, iFan;
    Vec_PtrClear( vCuts );
    Amap_NodeForEachCut( pFanin, pCut, c )
    {
        iCompl = pCut->fInv ^ fComplFanin;
        iFan   = !pCut->iMat? 0: Abc_Var2Lit( pCut->iMat, iCompl );
        if ( iFan == Val )
            Vec_PtrPush( vCuts, pCut );
    }
    return Vec_PtrSize(vCuts) == 0;
}